

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int aec_buffer_encode(aec_stream *strm)

{
  int iVar1;
  
  iVar1 = aec_encode_init(strm);
  if (iVar1 == 0) {
    aec_encode(strm,1);
    iVar1 = 0;
    if (strm->state->flush == 1) {
      iVar1 = (uint)(strm->state->flushed != 0) * 2 + -2;
    }
    cleanup((EVP_PKEY_CTX *)strm);
  }
  return iVar1;
}

Assistant:

int aec_buffer_encode(struct aec_stream *strm)
{
    int status = aec_encode_init(strm);
    if (status != AEC_OK)
        return status;
    status = aec_encode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        cleanup(strm);
        return status;
    }
    return aec_encode_end(strm);
}